

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O3

void helper_rdtsc_x86_64(CPUX86State *env)

{
  uint64_t uVar1;
  ulong uVar2;
  uintptr_t unaff_retaddr;
  
  if (((env->cr[4] & 4) != 0) && ((env->hflags & 3) != 0)) {
    raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
  }
  cpu_svm_check_intercept_param_x86_64(env,0x6e,0,unaff_retaddr);
  uVar1 = cpu_get_tsc_x86_64(env);
  uVar2 = uVar1 + env->tsc_offset;
  env->regs[0] = uVar2 & 0xffffffff;
  env->regs[2] = uVar2 >> 0x20;
  return;
}

Assistant:

void helper_rdtsc(CPUX86State *env)
{
    uint64_t val;

    if ((env->cr[4] & CR4_TSD_MASK) && ((env->hflags & HF_CPL_MASK) != 0)) {
        raise_exception_ra(env, EXCP0D_GPF, GETPC());
    }
    cpu_svm_check_intercept_param(env, SVM_EXIT_RDTSC, 0, GETPC());

    val = cpu_get_tsc(env) + env->tsc_offset;
    env->regs[R_EAX] = (uint32_t)(val);
    env->regs[R_EDX] = (uint32_t)(val >> 32);
}